

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRC.cpp
# Opt level: O0

uint CalculateCRC32(char *in)

{
  uint local_14;
  char *pcStack_10;
  uint crc;
  char *in_local;
  
  local_14 = 0xffffffff;
  for (pcStack_10 = in; *pcStack_10 != '\0'; pcStack_10 = pcStack_10 + 1) {
    local_14 = local_14 >> 8 ^ crc_32_tab[(local_14 ^ (int)*pcStack_10) & 0xff];
  }
  return local_14 ^ 0xffffffff;
}

Assistant:

unsigned int CalculateCRC32(const char* in)
{
    unsigned int crc = (unsigned int)-1;
    while (*in != '\0')
    {
        crc = (crc >> 8) ^ crc_32_tab[(crc ^ *in) & 0xFF];
        in++;
    }
    return crc ^ (unsigned int)-1;
}